

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

int StringHold(Situation *s)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *in_RDI;
  int capture_col_3;
  int capture_row_3;
  int i_3;
  int capture_col_2;
  int capture_row_2;
  int i_2;
  int capture_col_1;
  int capture_row_1;
  int i_1;
  int capture_col;
  int capture_row;
  int i;
  int r;
  int string_value [2];
  int opp_side_tag;
  int side_tag;
  int y;
  int x;
  int pos_str;
  int pos_to;
  int pos_from;
  int dir;
  uint in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  int local_5c;
  int local_50;
  int local_44;
  int local_38;
  int local_34;
  int local_30 [4];
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  int *local_8;
  
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    local_30[local_34] = 0;
    local_30[3] = local_34 * 0x10 + 0x10;
    local_30[2] = local_34 * -0x10 + 0x20;
    for (local_38 = 7; local_38 < 9; local_38 = local_38 + 1) {
      local_10 = (uint)*(byte *)((long)local_8 + (long)(local_30[3] + local_38) + 0x104);
      if (local_10 != 0) {
        local_14 = (uint)*(byte *)((long)local_8 + (long)local_30[2] + 0x104);
        if (local_14 != 0) {
          local_1c = GetCol(local_10);
          local_20 = GetRow(local_10);
          iVar5 = local_1c;
          iVar3 = GetCol(local_14);
          if (iVar5 == iVar3) {
            local_c = (uint)((int)local_14 <= (int)local_10);
            in_stack_ffffffffffffff94 =
                 (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                 (ulong)*(ushort *)((long)local_8 + (long)local_1c * 2 + 0x154) * 8
                                 + 0x31cd84 + (long)(int)local_c);
            uVar4 = GetRow(local_14);
            if (((in_stack_ffffffffffffff94 == uVar4) &&
                (local_18 = local_1c +
                            (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                            (ulong)*(ushort *)
                                                    ((long)local_8 + (long)local_1c * 2 + 0x154) * 8
                                            + 0x31cd82 + (long)(int)local_c) * 0x10,
                ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
               ((0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)] &&
                (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                     (Situation *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff8c), !bVar2)))) {
              local_30[local_34] =
                   (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
            }
          }
          else {
            in_stack_ffffffffffffff90 = local_20;
            iVar5 = GetRow(local_14);
            if (in_stack_ffffffffffffff90 == iVar5) {
              local_c = (uint)((int)local_14 <= (int)local_10);
              in_stack_ffffffffffffff8c =
                   (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                   (ulong)*(ushort *)((long)local_8 + (long)local_20 * 2 + 0x154) *
                                   8 + 0x313d84 + (long)(int)local_c);
              uVar4 = GetCol(local_14);
              if ((((in_stack_ffffffffffffff8c == uVar4) &&
                   (local_18 = local_20 * 0x10 +
                               (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                               (ulong)*(ushort *)
                                                       ((long)local_8 + (long)local_20 * 2 + 0x154)
                                               * 8 + 0x313d82 + (long)(int)local_c),
                   ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                  (0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)])) &&
                 (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                      (Situation *)
                                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                      in_stack_ffffffffffffff8c), !bVar2)) {
                local_30[local_34] =
                     (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
              }
            }
          }
        }
        for (local_44 = 7; local_44 < 9; local_44 = local_44 + 1) {
          local_14 = (uint)*(byte *)((long)local_8 + (long)(local_30[2] + local_44) + 0x104);
          if (local_14 != 0) {
            local_1c = GetCol(local_10);
            local_20 = GetRow(local_10);
            iVar3 = local_1c;
            iVar6 = GetCol(local_14);
            iVar5 = local_20;
            if (iVar3 == iVar6) {
              local_c = (uint)((int)local_14 <= (int)local_10);
              bVar1 = *(byte *)((long)(local_20 + -3) * 0x2000 +
                                (ulong)*(ushort *)((long)local_8 + (long)local_1c * 2 + 0x154) * 8 +
                                0x31cd84 + (long)(int)local_c);
              uVar4 = GetRow(local_14);
              if ((((bVar1 == uVar4) &&
                   (local_18 = local_1c +
                               (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                               (ulong)*(ushort *)
                                                       ((long)local_8 + (long)local_1c * 2 + 0x154)
                                               * 8 + 0x31cd82 + (long)(int)local_c) * 0x10,
                   ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                  (0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)])) &&
                 ((bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                       (Situation *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c), !bVar2 &&
                  (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                       (Situation *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c), !bVar2)))) {
                local_30[local_34] =
                     (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
              }
            }
            else {
              iVar3 = GetRow(local_14);
              if (iVar5 == iVar3) {
                local_c = (uint)((int)local_14 <= (int)local_10);
                bVar1 = *(byte *)((long)(local_1c + -3) * 0x1000 +
                                  (ulong)*(ushort *)((long)local_8 + (long)local_20 * 2 + 0x154) * 8
                                  + 0x313d84 + (long)(int)local_c);
                uVar4 = GetCol(local_14);
                if (((bVar1 == uVar4) &&
                    (local_18 = local_20 * 0x10 +
                                (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                                (ulong)*(ushort *)
                                                        ((long)local_8 + (long)local_20 * 2 + 0x154)
                                                * 8 + 0x313d82 + (long)(int)local_c),
                    ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                   ((0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)] &&
                    ((bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                          (Situation *)
                                          CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),
                                          in_stack_ffffffffffffff8c), !bVar2 &&
                     (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                          (Situation *)
                                          CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),
                                          in_stack_ffffffffffffff8c), !bVar2)))))) {
                  local_30[local_34] =
                       (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
                }
              }
            }
          }
        }
      }
    }
    for (local_50 = 9; local_50 < 0xb; local_50 = local_50 + 1) {
      local_10 = (uint)*(byte *)((long)local_8 + (long)(local_30[3] + local_50) + 0x104);
      if (local_10 != 0) {
        local_14 = (uint)*(byte *)((long)local_8 + (long)local_30[2] + 0x104);
        if (local_14 != 0) {
          local_1c = GetCol(local_10);
          local_20 = GetRow(local_10);
          iVar3 = local_1c;
          iVar6 = GetCol(local_14);
          iVar5 = local_20;
          if (iVar3 == iVar6) {
            local_c = (uint)((int)local_14 <= (int)local_10);
            bVar1 = *(byte *)((long)(local_20 + -3) * 0x2000 +
                              (ulong)*(ushort *)((long)local_8 + (long)local_1c * 2 + 0x154) * 8 +
                              0x31cd86 + (long)(int)local_c);
            uVar4 = GetRow(local_14);
            if ((((bVar1 == uVar4) &&
                 (local_18 = local_1c +
                             (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                             (ulong)*(ushort *)
                                                     ((long)local_8 + (long)local_1c * 2 + 0x154) *
                                             8 + 0x31cd84 + (long)(int)local_c) * 0x10,
                 ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                (0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)])) &&
               (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                    (Situation *)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                    in_stack_ffffffffffffff8c), !bVar2)) {
              local_30[local_34] =
                   (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
            }
          }
          else {
            iVar3 = GetRow(local_14);
            if (iVar5 == iVar3) {
              local_c = (uint)((int)local_14 <= (int)local_10);
              bVar1 = *(byte *)((long)(local_1c + -3) * 0x1000 +
                                (ulong)*(ushort *)((long)local_8 + (long)local_20 * 2 + 0x154) * 8 +
                                0x313d86 + (long)(int)local_c);
              uVar4 = GetCol(local_14);
              if (((bVar1 == uVar4) &&
                  (local_18 = local_20 * 0x10 +
                              (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                              (ulong)*(ushort *)
                                                      ((long)local_8 + (long)local_20 * 2 + 0x154) *
                                              8 + 0x313d84 + (long)(int)local_c),
                  ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                 ((0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)] &&
                  (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                       (Situation *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c), !bVar2)))) {
                local_30[local_34] =
                     (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
              }
            }
          }
        }
        for (local_5c = 7; local_5c < 9; local_5c = local_5c + 1) {
          local_14 = (uint)*(byte *)((long)local_8 + (long)(local_30[2] + local_5c) + 0x104);
          if (local_14 != 0) {
            local_1c = GetCol(local_10);
            local_20 = GetRow(local_10);
            iVar3 = local_1c;
            iVar6 = GetCol(local_14);
            iVar5 = local_20;
            if (iVar3 == iVar6) {
              local_c = (uint)((int)local_14 <= (int)local_10);
              uVar4 = (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                      (ulong)*(ushort *)((long)local_8 + (long)local_1c * 2 + 0x154)
                                      * 8 + 0x31cd86 + (long)(int)local_c);
              in_stack_ffffffffffffffa0 = uVar4;
              uVar7 = GetRow(local_14);
              if (((uVar4 == uVar7) &&
                  (local_18 = local_1c +
                              (uint)*(byte *)((long)(local_20 + -3) * 0x2000 +
                                              (ulong)*(ushort *)
                                                      ((long)local_8 + (long)local_1c * 2 + 0x154) *
                                              8 + 0x31cd84 + (long)(int)local_c) * 0x10,
                  ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                 ((0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)] &&
                  (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                       (Situation *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,in_stack_ffffffffffffff8c), !bVar2)))) {
                local_30[local_34] =
                     (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
              }
            }
            else {
              iVar3 = GetRow(local_14);
              if (iVar5 == iVar3) {
                local_c = (uint)((int)local_14 <= (int)local_10);
                uVar4 = (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                        (ulong)*(ushort *)
                                                ((long)local_8 + (long)local_20 * 2 + 0x154) * 8 +
                                        0x313d86 + (long)(int)local_c);
                in_stack_ffffffffffffff9c = uVar4;
                uVar7 = GetCol(local_14);
                if (((uVar4 == uVar7) &&
                    (local_18 = local_20 * 0x10 +
                                (uint)*(byte *)((long)(local_1c + -3) * 0x1000 +
                                                (ulong)*(ushort *)
                                                        ((long)local_8 + (long)local_20 * 2 + 0x154)
                                                * 8 + 0x313d84 + (long)(int)local_c),
                    ((uint)*(byte *)((long)local_8 + (long)local_18 + 4) & local_30[2]) != 0)) &&
                   ((0 < VALUABLE_STRING_PIECES[*(byte *)((long)local_8 + (long)local_18 + 4)] &&
                    (bVar2 = IfProtected(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                         (Situation *)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                         in_stack_ffffffffffffff8c), !bVar2)))) {
                  local_30[local_34] =
                       (int)""[(int)((local_14 - local_18) + 0x100)] + local_30[local_34];
                }
              }
            }
          }
        }
      }
    }
  }
  iVar5 = SideValue(*local_8,local_30[0] - local_30[1]);
  return iVar5;
}

Assistant:

int StringHold(Situation &s)
{
    int dir, pos_from, pos_to, pos_str;
    int x, y, side_tag, opp_side_tag;
    int string_value[2];

    for (int r = 0; r < 2; r++)
    {
        string_value[r] = 0;
        side_tag = 16 + (r << 4);
        opp_side_tag = 32 - (r << 4);
        //考察用車牵制的情况
        for (int i = 7; i <= 8; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to)) //纵向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        // 如果车用炮的吃法(炮用超级炮的着法)能吃到目标子"sqDst"，牵制就成立了，下同
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4); //计算被牵制的子位置，是车(炮)本身能吃到的棋子
                            if (s.current_board[pos_str] & opp_side_tag)                                         //被牵制子必须是对方的子
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to)) // 如果被牵制子是有价值的，而且被牵制子没有保护(被目标子保护不算)，那么牵制是有价值的
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to)) //横向牵制
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].rook_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].rook_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_to, s) && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }

        // 考查用炮来牵制的情况
        for (int i = 9; i <= 10; i++)
        {
            pos_from = s.current_pieces[side_tag + i];
            if (pos_from)
            {
                //考察牵制目标是帅(将)的情况
                pos_to = s.current_pieces[opp_side_tag];
                if (pos_to)
                {
                    x = GetCol(pos_from);
                    y = GetRow(pos_from);
                    if (x == GetCol(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                        if (capture_row == GetRow(pos_to))
                        {
                            pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                    else if (y == GetRow(pos_to))
                    {
                        dir = (pos_from < pos_to ? 0 : 1);
                        int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                        if (capture_col == GetCol(pos_to))
                        {
                            pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                            if (s.current_board[pos_str] & opp_side_tag)
                            {
                                if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                {
                                    string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                }
                            }
                        }
                    }
                }

                // 考查牵制目标是车的情况
                for (int i = 7; i <= 8; i++)
                {
                    pos_to = s.current_pieces[opp_side_tag + i];
                    if (pos_to)
                    {
                        x = GetCol(pos_from);
                        y = GetRow(pos_from);
                        if (x == GetCol(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_row = ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].supercannon_capture[dir];
                            if (capture_row == GetRow(pos_to))
                            {
                                pos_str = x + (ROOK_CANNON_CAN_GET_COL[y - 3][s.bit_col[x]].cannon_capture[dir] << 4);
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                        else if (y == GetRow(pos_to))
                        {
                            dir = (pos_from < pos_to ? 0 : 1);
                            int capture_col = ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].supercannon_capture[dir];
                            if (capture_col == GetCol(pos_to))
                            {
                                pos_str = (y << 4) + ROOK_CANNON_CAN_GET_ROW[x - 3][s.bit_col[y]].cannon_capture[dir];
                                if (s.current_board[pos_str] & opp_side_tag)
                                {
                                    if (VALUABLE_STRING_PIECES[s.current_board[pos_str]] > 0 && !IfProtected(1 - r, pos_str, s, pos_to))
                                    {
                                        string_value[r] += STRING_VALUE_TAB[pos_to - pos_str + 256];
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return SideValue(s.current_player, string_value[RED] - string_value[BLACK]);
}